

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void insert(upb_table *t,lookupkey_t key,upb_key tabkey,upb_value val,uint32_t hash,
           hashfunc_t *hashfunc,eqlfunc_t *eql)

{
  upb_key uVar1;
  upb_tabent *puVar2;
  _Bool _Var3;
  uint32_t uVar4;
  ulong uVar5;
  upb_tabent *puVar6;
  uint uVar7;
  upb_tabent *puVar8;
  upb_tabent *puVar9;
  _upb_tabent *p_Var10;
  upb_tabent *puVar11;
  
  uVar4 = t->count;
  puVar6 = t->entries;
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar7 = t->mask & hash;
    if (puVar6[uVar7].key.num != 0) {
      p_Var10 = puVar6 + uVar7;
      do {
        _Var3 = (*eql)(p_Var10->key,key);
        if (_Var3) {
          __assert_fail("findentry(t, key, hash, eql) == ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                        ,0xbb,
                        "void insert(upb_table *, lookupkey_t, upb_key, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                       );
        }
        p_Var10 = p_Var10->next;
      } while (p_Var10 != (_upb_tabent *)0x0);
      uVar4 = t->count;
      puVar6 = t->entries;
    }
  }
  t->count = uVar4 + 1;
  uVar5 = (ulong)(t->mask & hash);
  puVar11 = puVar6 + uVar5;
  if ((puVar11->key).num != 0) {
    uVar7 = t->mask + 1;
    puVar8 = puVar6 + uVar7;
    puVar2 = puVar6 + uVar5 + 1;
    while (puVar9 = puVar2, puVar9 < puVar8) {
      puVar2 = puVar9 + 1;
      if ((puVar9->key).num == 0) goto LAB_0028477a;
    }
    if (uVar7 == 0) goto LAB_002847fc;
    while (puVar9 = puVar6, (puVar6->key).num != 0) {
      puVar6 = puVar6 + 1;
      if (puVar8 <= puVar6) {
LAB_002847fc:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                      ,0x90,"upb_tabent *emptyent(upb_table *, upb_tabent *)");
      }
    }
LAB_0028477a:
    uVar4 = (*hashfunc)(puVar11->key);
    uVar7 = t->mask;
    puVar6 = t->entries;
    if (puVar6 + (uVar4 & uVar7) == puVar11) {
      puVar9->next = puVar11->next;
      puVar11->next = puVar9;
      goto LAB_0028482e;
    }
    puVar9->next = puVar11->next;
    uVar1 = puVar11->key;
    (puVar9->val).val = (puVar11->val).val;
    puVar9->key = uVar1;
    puVar6 = puVar6 + (uVar4 & uVar7);
    while (p_Var10 = puVar6->next, p_Var10 != puVar11) {
      puVar6 = p_Var10;
      if (p_Var10 == (_upb_tabent *)0x0) {
        __assert_fail("chain",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                      ,0xd7,
                      "void insert(upb_table *, lookupkey_t, upb_key, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                     );
      }
    }
    puVar6->next = puVar9;
  }
  puVar11->next = (_upb_tabent *)0x0;
  puVar9 = puVar11;
LAB_0028482e:
  puVar9->key = tabkey;
  (puVar9->val).val = val.val;
  if (t->count != 0) {
    uVar7 = hash & t->mask;
    if (t->entries[uVar7].key.num != 0) {
      puVar6 = t->entries + uVar7;
      do {
        _Var3 = (*eql)(puVar6->key,key);
        if (_Var3) goto LAB_0028487f;
        puVar6 = puVar6->next;
      } while (puVar6 != (_upb_tabent *)0x0);
    }
  }
  puVar6 = (upb_tabent *)0x0;
LAB_0028487f:
  if (puVar6 != puVar9) {
    __assert_fail("findentry(t, key, hash, eql) == our_e",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                  ,0xe0,
                  "void insert(upb_table *, lookupkey_t, upb_key, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                 );
  }
  return;
}

Assistant:

static void insert(upb_table* t, lookupkey_t key, upb_key tabkey, upb_value val,
                   uint32_t hash, hashfunc_t* hashfunc, eqlfunc_t* eql) {
  upb_tabent* mainpos_e;
  upb_tabent* our_e;

  UPB_ASSERT(findentry(t, key, hash, eql) == NULL);

  t->count++;
  mainpos_e = getentry_mutable(t, hash);
  our_e = mainpos_e;

  if (upb_tabent_isempty(mainpos_e)) {
    /* Our main position is empty; use it. */
    our_e->next = NULL;
  } else {
    /* Collision. */
    upb_tabent* new_e = emptyent(t, mainpos_e);
    /* Head of collider's chain. */
    upb_tabent* chain = getentry_mutable(t, hashfunc(mainpos_e->key));
    if (chain == mainpos_e) {
      /* Existing ent is in its main position (it has the same hash as us, and
       * is the head of our chain).  Insert to new ent and append to this chain.
       */
      new_e->next = mainpos_e->next;
      mainpos_e->next = new_e;
      our_e = new_e;
    } else {
      /* Existing ent is not in its main position (it is a node in some other
       * chain).  This implies that no existing ent in the table has our hash.
       * Evict it (updating its chain) and use its ent for head of our chain. */
      *new_e = *mainpos_e; /* copies next. */
      while (chain->next != mainpos_e) {
        chain = (upb_tabent*)chain->next;
        UPB_ASSERT(chain);
      }
      chain->next = new_e;
      our_e = mainpos_e;
      our_e->next = NULL;
    }
  }
  our_e->key = tabkey;
  our_e->val = val;
  UPB_ASSERT(findentry(t, key, hash, eql) == our_e);
}